

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncFileExists(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                 vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  path local_68;
  undefined1 local_48 [8];
  path fullName;
  StringLiteral *fileName;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  
  bVar1 = getExpFuncParameter(parameters,0,(StringLiteral **)((long)&fullName._path.field_2 + 8),
                              funcName,false);
  if (bVar1) {
    StringLiteral::path(&local_68,(StringLiteral *)fullName._path.field_2._8_8_);
    getFullPathName((path *)local_48,&local_68);
    ghc::filesystem::path::~path(&local_68);
    bVar1 = ghc::filesystem::exists((path *)local_48);
    ExpressionValue::ExpressionValue(__return_storage_ptr__,(ulong)bVar1);
    ghc::filesystem::path::~path((path *)local_48);
  }
  else {
    ExpressionValue::ExpressionValue(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncFileExists(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* fileName;
	GET_PARAM(parameters,0,fileName);

	auto fullName = getFullPathName(fileName->path());
	return ExpressionValue(fs::exists(fullName) ? INT64_C(1) : INT64_C(0));
}